

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InstructionTreeVm.cpp
# Opt level: O0

VmValue * CompileVmVoid(ExpressionContext *ctx,VmModule *module,ExprVoid *node)

{
  VmValue *pVVar1;
  ExprVoid *node_local;
  VmModule *module_local;
  ExpressionContext *ctx_local;
  
  pVVar1 = anon_unknown.dwarf_aa461::CreateVoid(module);
  pVVar1 = anon_unknown.dwarf_aa461::CheckType(ctx,&node->super_ExprBase,pVVar1);
  return pVVar1;
}

Assistant:

VmValue* CompileVmVoid(ExpressionContext &ctx, VmModule *module, ExprVoid *node)
{
	return CheckType(ctx, node, CreateVoid(module));
}